

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::Matcher::ResetLoopInfos(Matcher *this)

{
  LoopInfo *pLVar1;
  long lVar2;
  Program *pPVar3;
  long lVar4;
  long lVar5;
  
  pPVar3 = (this->program).ptr;
  if (0 < pPVar3->numLoops) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pLVar1 = (this->loopInfos).ptr;
      *(undefined8 *)((long)pLVar1 + lVar4 + -8) = 0;
      lVar2 = *(long *)((long)&pLVar1->number + lVar4);
      if ((lVar2 != 0) && ((long)*(int *)(lVar2 + 0x10) != 0)) {
        memset(*(void **)(lVar2 + 8),0,(long)*(int *)(lVar2 + 0x10) << 2);
        *(undefined4 *)(lVar2 + 0x10) = 0;
        pPVar3 = (this->program).ptr;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < pPVar3->numLoops);
  }
  return;
}

Assistant:

void Matcher::ResetLoopInfos()
    {
        for (int i = 0; i < program->numLoops; i++)
        {
            loopInfos[i].Reset();
        }
    }